

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O2

cupdlp_retcode
cupdlp_ruiz_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                   cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  uint len;
  uint len_00;
  int iVar1;
  int iVar2;
  int j_1;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  int iVar3;
  ulong uVar4;
  cupdlp_retcode cVar5;
  ulong uVar6;
  size_t __nmemb;
  int j;
  ulong uVar7;
  cupdlp_float cVar8;
  double dVar9;
  double dVar10;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  __nmemb = (size_t)(int)len_00;
  col_scaling = (cupdlp_float *)calloc(__nmemb,8);
  cVar5 = 1;
  if (col_scaling != (cupdlp_float *)0x0) {
    row_scaling = (cupdlp_float *)calloc((long)(int)len,8);
    if (row_scaling != (cupdlp_float *)0x0) {
      uVar6 = 0;
      if (0 < (int)len_00) {
        uVar6 = (ulong)len_00;
      }
      for (iVar3 = 0; iVar3 < scaling->RuizTimes; iVar3 = iVar3 + 1) {
        memset(col_scaling,0,__nmemb * 8);
        memset(row_scaling,0,(long)(int)len * 8);
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          iVar1 = csc->colMatBeg[uVar7];
          iVar2 = csc->colMatBeg[uVar7 + 1];
          cVar8 = 0.0;
          if (iVar2 != iVar1) {
            dVar9 = GenNorm(csc->colMatElem + iVar1,iVar2 - iVar1,scaling->RuizNorm);
            if (dVar9 < 0.0) {
              cVar8 = sqrt(dVar9);
            }
            else {
              cVar8 = SQRT(dVar9);
            }
          }
          col_scaling[uVar7] = cVar8;
        }
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          if ((col_scaling[uVar7] == 0.0) && (!NAN(col_scaling[uVar7]))) {
            col_scaling[uVar7] = 1.0;
          }
        }
        if (scaling->RuizNorm < INFINITY) {
          puts("Currently only support infinity norm for Ruiz scaling");
          exit(1);
        }
        if (0 < (int)len) {
          uVar7 = (ulong)(uint)csc->colMatBeg[__nmemb];
          if (csc->colMatBeg[__nmemb] < 1) {
            uVar7 = 0;
          }
          for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            dVar9 = csc->colMatElem[uVar4];
            dVar10 = -dVar9;
            if (-dVar9 <= dVar9) {
              dVar10 = dVar9;
            }
            if (row_scaling[csc->colMatIdx[uVar4]] <= dVar10 &&
                dVar10 != row_scaling[csc->colMatIdx[uVar4]]) {
              row_scaling[csc->colMatIdx[uVar4]] = dVar10;
            }
          }
          for (uVar7 = 0; len != uVar7; uVar7 = uVar7 + 1) {
            dVar9 = row_scaling[uVar7];
            cVar8 = 1.0;
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              if (dVar9 < 0.0) {
                cVar8 = sqrt(dVar9);
              }
              else {
                cVar8 = SQRT(dVar9);
              }
            }
            row_scaling[uVar7] = cVar8;
          }
        }
        scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
        cupdlp_cdot(scaling->colScale,col_scaling,len_00);
        cupdlp_cdot(scaling->rowScale,row_scaling,len);
      }
      cVar5 = 0;
      goto LAB_0036a126;
    }
  }
  row_scaling = (cupdlp_float *)0x0;
LAB_0036a126:
  free(col_scaling);
  free(row_scaling);
  return cVar5;
}

Assistant:

cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                   cupdlp_float *lower,
                                   cupdlp_float *upper, cupdlp_float *rhs,
                                   CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPwork *work, cupdlp_int max_iter,
// cupdlp_float norm)
{
  cupdlp_retcode retcode = RETCODE_OK;

  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  for (cupdlp_int i = 0; i < scaling->RuizTimes; i++) {
    cupdlp_zero(current_col_scaling, cupdlp_float, nCols);
    cupdlp_zero(current_row_scaling, cupdlp_float, nRows);

    if (csc != NULL) {
      for (int j = 0; j < nCols; j++) {
        if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
          current_col_scaling[j] = 0;
        } else {
          current_col_scaling[j] = SQRTF(GenNorm(
              &csc->colMatElem[csc->colMatBeg[j]],
              csc->colMatBeg[j + 1] - csc->colMatBeg[j], scaling->RuizNorm));
        }
      }
    }
    for (int j = 0; j < nCols; j++) {
      if (current_col_scaling[j] == 0.0) {
        current_col_scaling[j] = 1.0;
      }
    }

    if (scaling->RuizNorm == INFINITY) {
      if (nRows > 0 && csc != NULL) {
        // inf norm of rows of csc
        for (int j = 0; j < csc->colMatBeg[nCols]; j++) {
          if (current_row_scaling[csc->colMatIdx[j]] <
              ABS(csc->colMatElem[j])) {
            current_row_scaling[csc->colMatIdx[j]] = ABS(csc->colMatElem[j]);
          }
        }
        for (int j = 0; j < nRows; j++) {
          if (current_row_scaling[j] == 0.0) {
            current_row_scaling[j] = 1.0;
          } else {
            current_row_scaling[j] = SQRTF(current_row_scaling[j]);
          }
        }
      }
    } else {
      cupdlp_printf("Currently only support infinity norm for Ruiz scaling\n");
      exit(1);
    }

    // apply scaling
    // scale_problem(work, current_col_scaling, current_row_scaling);
    scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                  current_row_scaling);

    // update scaling
    cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
    cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);
  }
exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}